

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwshandshake.hpp
# Opt level: O3

void __thiscall
WebSocketHandshakeKeyGen::static_for<5,_WebSocketHandshakeKeyGen::Sha1Loop<3>_>::operator()
          (static_for<5,_WebSocketHandshakeKeyGen::Sha1Loop<3>_> *this,uint32_t *a,uint32_t *b)

{
  uint uVar1;
  uint uVar2;
  static_for<4,_WebSocketHandshakeKeyGen::Sha1Loop<3>_> local_11;
  
  static_for<4,_WebSocketHandshakeKeyGen::Sha1Loop<3>_>::operator()(&local_11,a,b);
  uVar1 = *b ^ b[5] ^ b[10] ^ b[8];
  uVar2 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  b[8] = uVar2;
  uVar1 = a[2];
  a[4] = a[4] + (a[3] << 5 | a[3] >> 0x1b) + (a[1] ^ *a ^ uVar1) + uVar2 + 0x6ed9eba1;
  a[2] = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

void operator()(uint32_t *a, uint32_t *b) {
            static_for<N - 1, T>()(a, b);
            T::template f<N - 1>(a, b);
        }